

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

void sai_init_sparse_arrays(void)

{
  undefined8 *puVar1;
  _sparse_array *p_Var2;
  long lVar3;
  
  SPA = (_sparse_array *)malloc(0x640000);
  lVar3 = 0;
  do {
    p_Var2 = SPA;
    puVar1 = (undefined8 *)((long)&SPA->nblocks + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&p_Var2->active + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&p_Var2->blksize + lVar3) = 0;
    *(undefined8 *)((long)&SPA->offset + lVar3) = 0;
    *(undefined8 *)((long)&SPA->idx + lVar3) = 0;
    *(undefined8 *)((long)&SPA->jdx + lVar3) = 0;
    *(undefined8 *)((long)&SPA->val + lVar3) = 0;
    p_Var2 = SPA;
    *(undefined8 *)((long)&SPA->max_nnz + lVar3) = 0;
    *(undefined8 *)((long)&p_Var2->g_data + lVar3) = 999;
    *(undefined8 *)((long)&p_Var2->g_i + lVar3) = 999;
    *(undefined8 *)((long)&p_Var2->g_j + lVar3) = 999;
    lVar3 = lVar3 + 200;
  } while (lVar3 != 0x640000);
  return;
}

Assistant:

void sai_init_sparse_arrays()
{
  Integer i;
  SPA = (_sparse_array*)malloc(MAX_ARRAYS*sizeof(_sparse_array));
  for (i=0; i<MAX_ARRAYS; i++) {
    SPA[i].active = 0;
    SPA[i].ready = 0;
    SPA[i].nblocks = 0;
    SPA[i].blkidx = NULL;
    SPA[i].blksize = NULL;
    SPA[i].offset = NULL;
    SPA[i].idx = NULL;
    SPA[i].jdx = NULL;
    SPA[i].val = NULL;
    SPA[i].max_nnz = 0;
    SPA[i].g_data = GA_OFFSET-1;
    SPA[i].g_i = GA_OFFSET-1;
    SPA[i].g_j = GA_OFFSET-1;
  }
}